

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void LD_mangle(uchar *key,uchar *ret_key,int nbytes)

{
  int i;
  unsigned_long_long new_key;
  int nbytes_local;
  uchar *ret_key_local;
  uchar *key_local;
  
  new_key = 0;
  for (i = 0; i < nbytes; i = i + 1) {
    new_key = (long)(int)((uint)key[(nbytes - i) + -1] << ((byte)(i << 3) & 0x1f)) | new_key;
  }
  for (i = 0; i < nbytes; i = i + 1) {
    ret_key[i] = (uchar)((new_key * 0x7c32b16d & 0xffffffff) >> ((byte)(i << 3) & 0x3f));
  }
  return;
}

Assistant:

void LD_mangle(const unsigned char* key, unsigned char* ret_key,
	int nbytes) {
	unsigned long long new_key = 0;
	int i;
	for (i = 0; i < nbytes; ++i) {
		new_key |= key[nbytes - i - 1] << (i * 8);
	}
	new_key = (new_key * 2083697005) & (0xffffffff);
	for (i = 0; i < nbytes; ++i) {
		ret_key[i] = (new_key >> (i * 8)) & 0xff;
	}
}